

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O1

Result __thiscall
Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>
          (LAKBO *this,MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *t0,
          MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *t1)

{
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  Result RVar2;
  long lVar3;
  anon_class_8_1_54a39818_for__func aVar4;
  int iVar5;
  bool bVar6;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  local_1d0;
  anon_class_72_1_a86c6e30_for__func local_188;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>_>
  local_140;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>
  local_b0;
  
  aVar4.x = (t0->_factors)._stack;
  pMVar1 = (t0->_factors)._cursor;
  lVar3 = (long)pMVar1 - (long)aVar4.x;
  bVar6 = pMVar1 == aVar4.x;
  if (bVar6) {
    iVar5 = 0;
    aVar4.x = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  }
  else {
    iVar5 = (aVar4.x)->power;
  }
  local_1d0._iter._current.
  super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
  ._isSome = !bVar6;
  local_1d0._iter._master._inner._inner._next = (unsigned_long)!bVar6;
  local_1d0._iter._master._inner._inner._to = (lVar3 >> 2) * 0x6db6db6db6db6db7;
  if (local_1d0._iter._current.
      super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
      ._isSome) {
    local_1d0._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem._8_8_ = 0;
    local_1d0._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem._20_4_ = 0;
    local_1d0._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem.init._iter._func.x = (anon_class_8_1_54a39818_for__func)aVar4.x;
    local_1d0._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem.init._iter._inner._to = iVar5;
  }
  local_1d0._iter._master._inner._inner._from = 0;
  aVar4.x = (t1->_factors)._stack;
  pMVar1 = (t1->_factors)._cursor;
  local_188.other._iter._master._inner._inner._to =
       ((long)pMVar1 - (long)aVar4.x >> 2) * 0x6db6db6db6db6db7;
  local_188.other._iter._current.
  super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
  ._isSome = pMVar1 == aVar4.x;
  if (local_188.other._iter._current.
      super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
      ._isSome) {
    iVar5 = 0;
    aVar4.x = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  }
  else {
    iVar5 = (aVar4.x)->power;
  }
  local_188.other._iter._master._inner._inner._next =
       (unsigned_long)
       !local_188.other._iter._current.
        super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
        ._isSome;
  local_188.other._iter._current.
  super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
  ._isSome = !local_188.other._iter._current.
              super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
              ._isSome;
  local_188.other._iter._master._inner._inner._from = 0;
  if (local_188.other._iter._current.
      super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
      ._isSome) {
    local_188.other._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem._8_8_ = 0;
    local_188.other._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem._20_4_ = 0;
    local_188.other._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem.init._iter._func.x = (anon_class_8_1_54a39818_for__func)aVar4.x;
    local_188.other._iter._current.
    super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>
    ._elem._elem.init._iter._inner._to = iVar5;
  }
  local_1d0._iter._master._inner._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)t0;
  local_188.other._iter._master._inner._func.a =
       (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)t1;
  ::Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/ALASCA/Ordering.hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>_>
  ::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16)>
            (&local_140,&local_1d0,&local_188);
  ::Lib::
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>const&>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)#1}::operator()(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::{lambda(auto:1&)#1},Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::Integer...l::PolyNf_const&>>>>>)::{lambda(Kernel::PolyNf_const&)#1},std::pair<Kernel::PolyNf,Kernel::PolyNf>>>
  ::
  map<Kernel::LAKBO::cmpSameSkeleton<Kernel::NumTraits<Kernel::IntegerConstantType>>(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&,Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)const::_lambda(auto:1)_1_>
            (&local_b0,&local_140,(anon_class_8_1_8991fb9c_for__func)this);
  RVar2 = AlascaOrderingUtils::
          lexIter<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:95:18),_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:97:20),_const_Kernel::PolyNf_&>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1678:16),_std::pair<Kernel::PolyNf,_Kernel::PolyNf>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_ALASCA_Ordering_hpp:101:16),_Kernel::Ordering::Result>_>_>
                    (&local_b0);
  return RVar2;
}

Assistant:

Ordering::Result cmpSameSkeleton(MonomFactors<NumTraits> const& t0, MonomFactors<NumTraits> const& t1) const 
  { 
    auto iterFlat = [](MonomFactors<NumTraits> const& m) {
      return m.iter()
        .flatMap([](auto& x) { return 
            range(0, x.power)
              .map([&](auto) -> auto& { return x.term; }); });
    };
    return AlascaOrderingUtils::lexIter(
        iterFlat(t0).zip(iterFlat(t1))
          .map([&](auto pair) { return cmpSameSkeleton(pair.first, pair.second); })
        );
  }